

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example6.cpp
# Opt level: O0

void __thiscall
MyRTPSession::OnRTCPSDESItem
          (MyRTPSession *this,RTPSourceData *srcdat,ItemType t,void *itemdata,size_t itemlength)

{
  uint32_t uVar1;
  undefined1 local_438 [8];
  char msg [1024];
  size_t local_30;
  size_t itemlength_local;
  void *itemdata_local;
  ItemType t_local;
  RTPSourceData *srcdat_local;
  MyRTPSession *this_local;
  
  memset(local_438,0,0x400);
  local_30 = itemlength;
  if (0x3ff < itemlength) {
    local_30 = 0x3ff;
  }
  memcpy(local_438,itemdata,local_30);
  uVar1 = jrtplib::RTPSourceData::GetSSRC(srcdat);
  printf("SSRC %x: Received SDES item (%d): %s",(ulong)uVar1,(ulong)t,local_438);
  return;
}

Assistant:

void OnRTCPSDESItem(RTPSourceData *srcdat, RTCPSDESPacket::ItemType t, const void *itemdata, size_t itemlength)
	{
		char msg[1024];

		memset(msg, 0, sizeof(msg));
		if (itemlength >= sizeof(msg))
			itemlength = sizeof(msg)-1;

		memcpy(msg, itemdata, itemlength);
		printf("SSRC %x: Received SDES item (%d): %s", (unsigned int)srcdat->GetSSRC(), (int)t, msg);
	}